

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManInvertMarks(If_DsdMan_t *p,int fVerbose)

{
  uint *puVar1;
  long lVar2;
  
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  if (0 < (p->vObjs).nSize) {
    lVar2 = 0;
    do {
      puVar1 = (uint *)((long)(p->vObjs).pArray[lVar2] + 4);
      *puVar1 = *puVar1 ^ 0x100;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (p->vObjs).nSize);
  }
  return;
}

Assistant:

void If_DsdManInvertMarks( If_DsdMan_t * p, int fVerbose )
{
    If_DsdObj_t * pObj; 
    int i;
    ABC_FREE( p->pCellStr );
    //Vec_WrdFreeP( &p->vConfigs );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        pObj->fMark = !pObj->fMark;
}